

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

void __thiscall cmCTestP4::IdentifyParser::~IdentifyParser(IdentifyParser *this)

{
  ~IdentifyParser(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

IdentifyParser(cmCTestP4* p4, const char* prefix, std::string& rev)
    : Rev(rev)
  {
    this->SetLog(&p4->Log, prefix);
    this->RegexIdentify.compile("^Change ([0-9]+) on");
  }